

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

bool Path::is_root_path(string *path)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  bool local_21;
  size_type index;
  string *path_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::front();
    if ((*pcVar2 == '/') && (lVar3 = std::__cxx11::string::size(), lVar3 == 1)) {
      return true;
    }
    lVar3 = std::__cxx11::string::find((char *)path,0x1bff34);
    local_21 = false;
    if (lVar3 != -1) {
      lVar4 = std::__cxx11::string::size();
      local_21 = lVar3 + 3 == lVar4;
    }
    path_local._7_1_ = local_21;
  }
  else {
    path_local._7_1_ = false;
  }
  return path_local._7_1_;
}

Assistant:

bool is_root_path(const string &path)
{
	if (path.empty())
		return false;

	if (path.front() == '/' && path.size() == 1)
		return true;

#ifdef _WIN32
	{
		auto index = (std::min)(path.find(":/"), path.find(":\\"));
		if (index != string::npos && (index + 2) == path.size())
			return true;
	}
#endif

	auto index = path.find("://");
	return index != string::npos && (index + 3) == path.size();
}